

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::price::subject::Subject::GetComponent
          (string *__return_storage_ptr__,Subject *this,string *key)

{
  uint uVar1;
  allocator<char> local_11;
  
  uVar1 = SubjectUtils::BinarySearch(&this->components_,key);
  if ((int)uVar1 < 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_11);
  }
  else {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               ((this->components_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start + (ulong)uVar1 + 1));
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Subject::GetComponent(std::string key) const
{
    int index = SubjectUtils::BinarySearch(&components_, key);

    if (index >= 0)
    {
        return components_[index + 1];
    }

    return "";
}